

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  unique_ptr<Measurements::Benchmark,_std::default_delete<Measurements::Benchmark>_> measurement;
  long *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string_view local_38;
  
  getArgv<std::__cxx11::string>(&local_58,argc,argv,4);
  local_38._M_len = local_58._M_string_length;
  local_38._M_str = local_58._M_dataplus._M_p;
  Measurements::get_measurement((Measurements *)&local_60,&local_38,argc,argv);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  (**(code **)*local_60)(local_60);
  (**(code **)(*local_60 + 0x10))(local_60);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
try {
    auto measurement
        = Measurements::get_measurement(getArgv<std::string>(argc, argv, 4), argc, argv);
    auto res = measurement->run();
    return 0;
} catch (const std::exception& e) {
    std::cerr << e.what() << std::endl;
    const char* help = "%s <obj count> <iteration count>";
    std::printf(help, argv[0]);
    return 1;
} catch (...) {
    std::cerr << "Unknown exception\n";
    return 1;
}